

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

void __thiscall higan::EventLoop::HandleTimeoutEvent(EventLoop *this)

{
  Timer *pTVar1;
  LogLevel LVar2;
  string *psVar3;
  TimerCallback *this_00;
  Timer *this_01;
  Logger local_348;
  Fmt local_130;
  
  std::vector<higan::Timer,_std::allocator<higan::Timer>_>::clear(&this->timeout_timers_);
  TimerManager::GetTimeoutTimer(&this->timer_manager_,&this->timeout_timers_);
  pTVar1 = (this->timeout_timers_).super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this->timeout_timers_).
                 super__Vector_base<higan::Timer,_std::allocator<higan::Timer>_>._M_impl.
                 super__Vector_impl_data._M_start; this_01 != pTVar1; this_01 = this_01 + 1) {
    LVar2 = Logger::GetLogLevel();
    if ((int)LVar2 < 2) {
      Logger::Logger(&local_348,INFO,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/EventLoop.cpp"
                     ,0x54,"HandleTimeoutEvent");
      psVar3 = Timer::GetName_abi_cxx11_(this_01);
      Fmt::Fmt(&local_130,"Timer: %s timeout",(psVar3->_M_dataplus)._M_p);
      Logger::operator<<(&local_348,&local_130);
      Logger::~Logger(&local_348);
    }
    this_00 = Timer::GetTimerCallback(this_01);
    std::function<void_(const_higan::Timer_&)>::operator()(this_00,this_01);
  }
  return;
}

Assistant:

void EventLoop::HandleTimeoutEvent()
{
	timeout_timers_.clear();
	timer_manager_.GetTimeoutTimer(&timeout_timers_);

	for (const Timer& timer : timeout_timers_)
	{
		LOG_INFO << higan::Fmt("Timer: %s timeout", timer.GetName().c_str());
		timer.GetTimerCallback()(timer);
	}
}